

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

void __thiscall QtMWidgets::Slider::paintEvent(Slider *this,QPaintEvent *param_1)

{
  int xRadius;
  QPalette *pQVar1;
  QColor *pQVar2;
  QColor *lightColor;
  QPainter p;
  QBrush local_60 [8];
  QRect grh;
  QColor grooveColor;
  QRect gr;
  QRect sh;
  
  sh = SliderPrivate::handleRect((this->d).d);
  gr = SliderPrivate::grooveRect((this->d).d);
  grh = SliderPrivate::grooveHighlightedRect((this->d).d,&sh,&gr);
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  pQVar1 = (QPalette *)QWidget::palette();
  pQVar2 = QPalette::color(pQVar1,Dark);
  grooveColor._0_8_ = *(undefined8 *)pQVar2;
  grooveColor._8_8_ = *(undefined8 *)((long)&pQVar2->ct + 4);
  QPainter::setPen((QColor *)&p);
  QBrush::QBrush(local_60,&grooveColor,SolidPattern);
  QPainter::setBrush((QBrush *)&p);
  QBrush::~QBrush(local_60);
  QPainter::drawRect(&p,&gr);
  QPainter::setPen((QColor *)&p);
  QBrush::QBrush(local_60,&((this->d).d)->highlightColor,SolidPattern);
  QPainter::setBrush((QBrush *)&p);
  QBrush::~QBrush(local_60);
  QPainter::drawRect(&p,&grh);
  QPainter::setRenderHint((RenderHint)&p,true);
  xRadius = ((this->d).d)->radius;
  pQVar1 = (QPalette *)QWidget::palette();
  pQVar2 = QPalette::color(pQVar1,Shadow);
  pQVar1 = (QPalette *)QWidget::palette();
  lightColor = QPalette::color(pQVar1,Base);
  drawSliderHandle(&p,&sh,xRadius,xRadius,pQVar2,lightColor);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
Slider::paintEvent( QPaintEvent * )
{
	const QRect sh = d->handleRect();
	const QRect gr = d->grooveRect();
	const QRect grh = d->grooveHighlightedRect( sh, gr );

	QPainter p( this );

	const QColor grooveColor = palette().color( QPalette::Dark );

	p.setPen( grooveColor );
	p.setBrush( grooveColor );

	p.drawRect( gr );

	p.setPen( d->highlightColor );
	p.setBrush( d->highlightColor );

	p.drawRect( grh );

	p.setRenderHint( QPainter::Antialiasing );
	drawSliderHandle( &p, sh, d->radius, d->radius,
		palette().color( QPalette::Shadow ),
		palette().color( QPalette::Base ) );
}